

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::ParseAnyValue(Parser *this,Value *val,FieldDef *field)

{
  uoffset_t uVar1;
  size_type sVar2;
  reference pvVar3;
  char *s_00;
  Type local_138;
  string local_120;
  uoffset_t local_fc;
  string local_f8;
  undefined1 local_d8 [8];
  string s;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  StructDef *local_58;
  StructDef *struct_def;
  uchar enum_idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  FieldDef *local_20;
  FieldDef *field_local;
  Value *val_local;
  Parser *this_local;
  
  local_20 = field;
  field_local = (FieldDef *)val;
  val_local = (Value *)this;
  switch((val->type).base_type) {
  case BASE_TYPE_STRING:
    std::__cxx11::string::string((string *)local_d8,(string *)&this->attribute_);
    Expect(this,1);
    local_fc = (uoffset_t)FlatBufferBuilder::CreateString(&this->builder_,(string *)local_d8);
    NumToString<unsigned_int>(&local_f8,local_fc);
    std::__cxx11::string::operator=
              ((string *)((field_local->super_Definition).name.field_2._M_local_buf + 8),
               (string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)local_d8);
    break;
  case BASE_TYPE_VECTOR:
    Expect(this,0x5b);
    Type::VectorType(&local_138,(Type *)field_local);
    uVar1 = ParseVector(this,&local_138);
    NumToString<unsigned_int>(&local_120,uVar1);
    std::__cxx11::string::operator=
              ((string *)((field_local->super_Definition).name.field_2._M_local_buf + 8),
               (string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    break;
  case BASE_TYPE_STRUCT:
    uVar1 = ParseTable(this,(val->type).struct_def);
    NumToString<unsigned_int>((string *)((long)&s.field_2 + 8),uVar1);
    std::__cxx11::string::operator=
              ((string *)((field_local->super_Definition).name.field_2._M_local_buf + 8),
               (string *)(s.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(s.field_2._M_local_buf + 8));
    break;
  case BASE_TYPE_UNION:
    if (field == (FieldDef *)0x0) {
      __assert_fail("field",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_parser.cpp"
                    ,0x14e,"void flatbuffers::Parser::ParseAnyValue(Value &, FieldDef *)");
    }
    sVar2 = std::
            vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
            ::size(&this->field_stack_);
    if ((sVar2 == 0) ||
       (pvVar3 = std::
                 vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                 ::back(&this->field_stack_),
       (pvVar3->second->value).type.base_type != BASE_TYPE_UTYPE)) {
      std::operator+(&local_40,"missing type field before this union value: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20);
      Error(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::
    vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
    ::back(&this->field_stack_);
    s_00 = (char *)std::__cxx11::string::c_str();
    struct_def._3_1_ = atot<unsigned_char>(s_00);
    local_58 = EnumDef::ReverseLookup
                         ((EnumDef *)
                          (field_local->super_Definition).name.field_2._M_allocated_capacity,
                          (uint)struct_def._3_1_);
    if (local_58 == (StructDef *)0x0) {
      std::operator+(&local_78,"illegal type id for: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20);
      Error(&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    uVar1 = ParseTable(this,local_58);
    NumToString<unsigned_int>(&local_98,uVar1);
    std::__cxx11::string::operator=
              ((string *)((field_local->super_Definition).name.field_2._M_local_buf + 8),
               (string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    break;
  default:
    ParseSingleValue(this,val);
  }
  return;
}

Assistant:

void Parser::ParseAnyValue(Value &val, FieldDef *field) {
  switch (val.type.base_type) {
    case BASE_TYPE_UNION: {
      assert(field);
      if (!field_stack_.size() ||
          field_stack_.back().second->value.type.base_type != BASE_TYPE_UTYPE)
        Error("missing type field before this union value: " + field->name);
      auto enum_idx = atot<unsigned char>(
                                    field_stack_.back().first.constant.c_str());
      auto struct_def = val.type.enum_def->ReverseLookup(enum_idx);
      if (!struct_def) Error("illegal type id for: " + field->name);
      val.constant = NumToString(ParseTable(*struct_def));
      break;
    }
    case BASE_TYPE_STRUCT:
      val.constant = NumToString(ParseTable(*val.type.struct_def));
      break;
    case BASE_TYPE_STRING: {
      auto s = attribute_;
      Expect(kTokenStringConstant);
      val.constant = NumToString(builder_.CreateString(s).o);
      break;
    }
    case BASE_TYPE_VECTOR: {
      Expect('[');
      val.constant = NumToString(ParseVector(val.type.VectorType()));
      break;
    }
    default:
      ParseSingleValue(val);
      break;
  }
}